

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::fill<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> it,size_t n,fill_t<wchar_t> *fill
          )

{
  byte bVar1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar2;
  
  bVar1 = fill->size_;
  if ((ulong)bVar1 == 1) {
    bVar2 = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long,wchar_t>
                      (it,n,fill->data_);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar2.container;
  }
  if (n != 0) {
    do {
      it = copy_str<wchar_t,wchar_t_const*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                     (fill->data_,fill->data_ + bVar1,it);
      n = n - 1;
    } while (n != 0);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)it.container;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const fill_t<Char>& fill) -> OutputIt {
  auto fill_size = fill.size();
  if (fill_size == 1) return detail::fill_n(it, n, fill[0]);
  auto data = fill.data();
  for (size_t i = 0; i < n; ++i)
    it = copy_str<Char>(data, data + fill_size, it);
  return it;
}